

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O0

void __thiscall CVmObjFile::read_data_mode(CVmObjFile *this,vm_val_t *retval)

{
  int iVar1;
  vm_obj_id_t obj;
  vmobjfile_ext_t *pvVar2;
  long lVar3;
  unsigned_long uVar4;
  CVmObject *this_00;
  vm_val_t *in_RSI;
  CVmObjFile *in_RDI;
  CVmDataSource *fp;
  vm_obj_id_t str_id;
  CVmObjString *str_obj;
  char buf [32];
  size_t in_stack_ffffffffffffff88;
  CVmDataSource *fp_00;
  char *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  CVmRun *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  CVmDataSource *in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffc9;
  
  pvVar2 = get_ext(in_RDI);
  fp_00 = pvVar2->fp;
  iVar1 = (*fp_00->_vptr_CVmDataSource[2])(fp_00,&stack0xffffffffffffffc8,1);
  if (iVar1 != 0) {
    vm_val_t::set_nil(in_RSI);
    return;
  }
  switch(in_stack_ffffffffffffffc8) {
  case 1:
    iVar1 = (*fp_00->_vptr_CVmDataSource[2])(fp_00,&stack0xffffffffffffffc8,4);
    if (iVar1 == 0) {
      lVar3 = osrp4s(&stack0xffffffffffffffc8);
      vm_val_t::set_int(in_RSI,(int32_t)lVar3);
      return;
    }
    break;
  default:
    CVmRun::throw_new_class
              (in_stack_ffffffffffffffa0,(vm_obj_id_t)((ulong)in_stack_ffffffffffffff98 >> 0x20),
               (uint)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    return;
  case 3:
    iVar1 = (*fp_00->_vptr_CVmDataSource[2])(fp_00,&stack0xffffffffffffffc8,2);
    if (iVar1 == 0) {
      ::osrp2(&stack0xffffffffffffffc8);
      obj = CVmObjString::create
                      ((int)((ulong)in_stack_ffffffffffffff90 >> 0x20),in_stack_ffffffffffffff88);
      this_00 = vm_objp(0);
      in_stack_ffffffffffffff90 = CVmObjString::cons_get_buf((CVmObjString *)this_00);
      iVar1 = ::osrp2(&stack0xffffffffffffffc8);
      iVar1 = (*fp_00->_vptr_CVmDataSource[2])(fp_00,in_stack_ffffffffffffff90,(long)(iVar1 + -2));
      if (iVar1 == 0) {
        vm_val_t::set_obj(in_RSI,obj);
        return;
      }
    }
    break;
  case 8:
    vm_val_t::set_true(in_RSI);
    return;
  case 0x20:
    iVar1 = (*fp_00->_vptr_CVmDataSource[2])(fp_00,&stack0xffffffffffffffc8,4);
    if (iVar1 == 0) {
      uVar4 = ::osrp4(&stack0xffffffffffffffc8);
      vm_val_t::set_enum(in_RSI,(uint32_t)uVar4);
      return;
    }
    break;
  case 0x21:
    iVar1 = CVmObjBigNum::read_from_data_file
                      ((vm_val_t *)CONCAT71(in_stack_ffffffffffffffc9,in_stack_ffffffffffffffc8),
                       in_stack_ffffffffffffffc0);
    goto joined_r0x002e4d37;
  case 0x22:
    iVar1 = CVmObjByteArray::read_from_data_file
                      ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       fp_00);
joined_r0x002e4d37:
    if (iVar1 == 0) {
      return;
    }
  }
  CVmRun::throw_new_class
            (in_stack_ffffffffffffffa0,(vm_obj_id_t)((ulong)in_stack_ffffffffffffff98 >> 0x20),
             (uint)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  return;
}

Assistant:

void CVmObjFile::read_data_mode(VMG_ vm_val_t *retval)
{
    char buf[32];
    CVmObjString *str_obj;
    vm_obj_id_t str_id;
    CVmDataSource *fp = get_ext()->fp;

    /* read the type flag */
    if (fp->read(buf, 1))
    {
        /* end of file - return nil */
        retval->set_nil();
        return;
    }

    /* see what we have */
    switch(buf[0])
    {
    case VMOBJFILE_TAG_INT:
        /* read the INT4 value */
        if (fp->read(buf, 4))
            goto io_error;

        /* set the integer value from the buffer */
        retval->set_int(osrp4s(buf));
        break;

    case VMOBJFILE_TAG_ENUM:
        /* read the UINT4 value */
        if (fp->read(buf, 4))
            goto io_error;

        /* set the 'enum' value */
        retval->set_enum(t3rp4u(buf));
        break;

    case VMOBJFILE_TAG_STRING:
        /* 
         *   read the string's length - note that this length is two
         *   higher than the actual length of the string, because it
         *   includes the length prefix bytes 
         */
        if (fp->read(buf, 2))
            goto io_error;

        /* 
         *   allocate a new string of the required size (deducting two
         *   bytes from the indicated size, since the string allocator
         *   only wants to know about the bytes of the string we want to
         *   store, not the length prefix part) 
         */
        str_id = CVmObjString::create(vmg_ FALSE, osrp2(buf) - 2);
        str_obj = (CVmObjString *)vm_objp(vmg_ str_id);

        /* read the bytes of the string into the object's buffer */
        if (fp->read(str_obj->cons_get_buf(), osrp2(buf) - 2))
            goto io_error;

        /* success - set the string return value, and we're done */
        retval->set_obj(str_id);
        break;

    case VMOBJFILE_TAG_TRUE:
        /* it's a simple 'true' value */
        retval->set_true();
        break;

    case VMOBJFILE_TAG_BIGNUM:
        /* read the BigNumber value and return a new BigNumber object */
        if (CVmObjBigNum::read_from_data_file(vmg_ retval, fp))
            goto io_error;
        break;

    case VMOBJFILE_TAG_BYTEARRAY:
        /* read the ByteArray value and return a new ByteArray object */
        if (CVmObjByteArray::read_from_data_file(vmg_ retval, fp))
            goto io_error;
        break;

    default:
        /* invalid data - throw an error */
        G_interpreter->throw_new_class(vmg_ G_predef->file_io_exc,
                                       0, "file I/O error");
    }

    /* done */
    return;

io_error:
    /* 
     *   we'll come here if we read the type tag correctly but encounter
     *   an I/O error reading the value - this indicates a corrupted input
     *   stream, so throw an I/O error 
     */
    G_interpreter->throw_new_class(vmg_ G_predef->file_io_exc,
                                   0, "file I/O error");
}